

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

char * soplex::
       getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *p_lp,int p_idx,NameSet *p_cnames,char *p_buf)

{
  Item *pIVar1;
  SPxColId SVar2;
  
  if (p_cnames != (NameSet *)0x0) {
    SVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::cId(p_lp,p_idx);
    pIVar1 = (p_cnames->set).theitem;
    if (-1 < pIVar1[(long)SVar2.super_DataKey >> 0x20].info) {
      return p_cnames->mem + pIVar1[(long)SVar2.super_DataKey >> 0x20].data;
    }
  }
  spxSnprintf(p_buf,0x10,"x%d",p_idx);
  return p_buf;
}

Assistant:

static const char* getColName(
   const SPxLPBase<R>& p_lp,
   int                    p_idx,
   const NameSet*         p_cnames,
   char*                  p_buf
)
{
   assert(p_buf != nullptr);
   assert(p_idx >= 0);
   assert(p_idx <  p_lp.nCols());

   if(p_cnames != nullptr)
   {
      DataKey key = p_lp.cId(p_idx);

      if(p_cnames->has(key))
         return (*p_cnames)[key];
   }

   spxSnprintf(p_buf, 16, "x%d", p_idx);

   return p_buf;
}